

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::fullBuildArgs(QString *__return_storage_ptr__,MakefileGenerator *this)

{
  QMakeProject *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  byte bVar4;
  CutResult CVar5;
  storage_type_conflict *psVar6;
  QArrayData *pQVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QString local_128;
  QString local_110;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QStringBuilder<const_char_(&)[5],_QString> local_d8;
  ProKey local_b8;
  ProString local_88;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::fileName();
  fileFixify(&local_58,this,&local_88.m_string,(FileFixifyTypes)0x0,true);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  qVar3 = local_58.d.size;
  pcVar2 = local_58.d.ptr;
  if ((QArrayData *)local_58.d.size == (QArrayData *)0x0) {
    bVar4 = 0;
  }
  else {
    pQVar1 = this->project;
    ProKey::ProKey(&local_b8,"QMAKE_MAKEFILE");
    QMakeEvaluator::first(&local_88,&pQVar1->super_QMakeEvaluator,&local_b8);
    local_d8.a = (char (*) [5])(long)local_88.m_offset;
    local_f8 = (QArrayData *)(long)local_88.m_length;
    CVar5 = QtPrivate::QContainerImplHelper::mid
                      (local_88.m_string.d.size,(qsizetype *)&local_d8,(qsizetype *)&local_f8);
    pQVar7 = local_f8;
    if (CVar5 == Null) {
      pQVar7 = (QArrayData *)0x0;
    }
    bVar4 = 1;
    if ((QArrayData *)qVar3 == pQVar7) {
      psVar6 = (storage_type_conflict *)0x0;
      if (CVar5 != Null) {
        psVar6 = local_88.m_string.d.ptr + (long)local_d8.a;
      }
      QVar8.m_data = pcVar2;
      QVar8.m_size = qVar3;
      QVar9.m_data = psVar6;
      QVar9.m_size = (qsizetype)pQVar7;
      bVar4 = QtPrivate::equalStrings(QVar8,QVar9);
      bVar4 = bVar4 ^ 1;
    }
  }
  if ((QArrayData *)qVar3 != (QArrayData *)0x0) {
    if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (bVar4 != 0) {
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_f8,this,&local_58);
    local_d8.b.d.size = local_e8;
    local_d8.b.d.ptr = pcStack_f0;
    local_d8.b.d.d = (Data *)local_f8;
    local_d8.a = (char (*) [5])0x2aacb0;
    local_f8 = (QArrayData *)0x0;
    pcStack_f0 = (char16_t *)0x0;
    local_e8 = 0;
    ::operator+=(__return_storage_ptr__,&local_d8);
    if (&(local_d8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,2,0x10);
      }
    }
  }
  pQVar1 = this->project;
  local_128.d.d = (pQVar1->m_projectFile).d.d;
  local_128.d.ptr = (pQVar1->m_projectFile).d.ptr;
  local_128.d.size = (pQVar1->m_projectFile).d.size;
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_128.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_128.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  fileFixify(&local_110,this,&local_128,(FileFixifyTypes)0x0,true);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_f8,this,&local_110);
  local_d8.b.d.size = local_e8;
  local_d8.b.d.ptr = pcStack_f0;
  local_d8.b.d.d = (Data *)local_f8;
  local_d8.a = (char (*) [5])0x2adf3e;
  local_f8 = (QArrayData *)0x0;
  pcStack_f0 = (char16_t *)0x0;
  local_e8 = 0;
  ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[2],_QString> *)&local_d8);
  if (&(local_d8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  if (&(local_110.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
  buildArgs((QString *)&local_d8,this,true);
  QString::append((QString *)__return_storage_ptr__);
  if ((QArrayData *)local_d8.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_d8.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_d8.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_d8.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8.a,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString MakefileGenerator::fullBuildArgs()
{
    QString ret;

    //output
    QString ofile = fileFixify(Option::output.fileName());
    if (!ofile.isEmpty() && ofile != project->first("QMAKE_MAKEFILE").toQStringView())
        ret += " -o " + escapeFilePath(ofile);

    //inputs
    ret += " " + escapeFilePath(fileFixify(project->projectFile()));

    // general options and arguments
    ret += buildArgs(true);

    return ret;
}